

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::popScope(AVisitor<hiberlite::ExtractModel> *this)

{
  size_type sVar1;
  runtime_error *this_00;
  reference pvVar2;
  AVisitor<hiberlite::ExtractModel> *this_local;
  
  sVar1 = std::
          stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>
          ::size(&this->stack);
  if (sVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"popScope with empty stack");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::
           stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>
           ::top(&this->stack);
  Scope::operator=(&this->scope,pvVar2);
  std::stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>::
  pop(&this->stack);
  return;
}

Assistant:

void AVisitor<C>::popScope()
{
	if(!stack.size())
		throw std::runtime_error("popScope with empty stack");
	scope=stack.top();
	stack.pop();
}